

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# polynomial.cpp
# Opt level: O3

ExprPtr __thiscall mathiu::impl::coefficientList(impl *this,ExprPtr *u,ExprPtr *x)

{
  Integer IVar1;
  undefined8 *puVar2;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  int i;
  ExprPtr EVar3;
  List result;
  vector<std::shared_ptr<const_mathiu::impl::Expr>,_std::allocator<std::shared_ptr<const_mathiu::impl::Expr>_>_>
  local_58;
  impl local_40 [8];
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_38;
  
  IVar1 = degree(u,x);
  local_58.
  super__Vector_base<std::shared_ptr<const_mathiu::impl::Expr>,_std::allocator<std::shared_ptr<const_mathiu::impl::Expr>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_58.
  super__Vector_base<std::shared_ptr<const_mathiu::impl::Expr>,_std::allocator<std::shared_ptr<const_mathiu::impl::Expr>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_58.
  super__Vector_base<std::shared_ptr<const_mathiu::impl::Expr>,_std::allocator<std::shared_ptr<const_mathiu::impl::Expr>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  if (-1 < IVar1) {
    i = 0;
    do {
      coefficient(local_40,u,x,i);
      std::
      vector<std::shared_ptr<mathiu::impl::Expr_const>,std::allocator<std::shared_ptr<mathiu::impl::Expr_const>>>
      ::emplace_back<std::shared_ptr<mathiu::impl::Expr_const>>
                ((vector<std::shared_ptr<mathiu::impl::Expr_const>,std::allocator<std::shared_ptr<mathiu::impl::Expr_const>>>
                  *)&local_58,(shared_ptr<const_mathiu::impl::Expr> *)local_40);
      if (local_38 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_38);
      }
      i = i + 1;
    } while (IVar1 + 1 != i);
  }
  puVar2 = (undefined8 *)operator_new(0x50);
  puVar2[1] = 0x100000001;
  *puVar2 = &PTR___Sp_counted_ptr_inplace_00263778;
  puVar2[2] = local_58.
              super__Vector_base<std::shared_ptr<const_mathiu::impl::Expr>,_std::allocator<std::shared_ptr<const_mathiu::impl::Expr>_>_>
              ._M_impl.super__Vector_impl_data._M_start;
  puVar2[3] = local_58.
              super__Vector_base<std::shared_ptr<const_mathiu::impl::Expr>,_std::allocator<std::shared_ptr<const_mathiu::impl::Expr>_>_>
              ._M_impl.super__Vector_impl_data._M_finish;
  puVar2[4] = local_58.
              super__Vector_base<std::shared_ptr<const_mathiu::impl::Expr>,_std::allocator<std::shared_ptr<const_mathiu::impl::Expr>_>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage;
  local_58.
  super__Vector_base<std::shared_ptr<const_mathiu::impl::Expr>,_std::allocator<std::shared_ptr<const_mathiu::impl::Expr>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_58.
  super__Vector_base<std::shared_ptr<const_mathiu::impl::Expr>,_std::allocator<std::shared_ptr<const_mathiu::impl::Expr>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_58.
  super__Vector_base<std::shared_ptr<const_mathiu::impl::Expr>,_std::allocator<std::shared_ptr<const_mathiu::impl::Expr>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  *(undefined1 *)(puVar2 + 9) = 0xe;
  *(undefined8 **)(this + 8) = puVar2;
  *(undefined8 **)this = puVar2 + 2;
  std::
  vector<std::shared_ptr<const_mathiu::impl::Expr>,_std::allocator<std::shared_ptr<const_mathiu::impl::Expr>_>_>
  ::~vector(&local_58);
  EVar3.super___shared_ptr<const_mathiu::impl::Expr,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       extraout_RDX._M_pi;
  EVar3.super___shared_ptr<const_mathiu::impl::Expr,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)this;
  return (ExprPtr)EVar3.super___shared_ptr<const_mathiu::impl::Expr,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

ExprPtr coefficientList(ExprPtr const &u, ExprPtr const &x)
    {
        auto const deg = degree(u, x);
        List result;
        for (auto i = 0; i <= deg; ++i)
        {
            result.emplace_back(coefficient(u, x, i));
        }
        return makeSharedExprPtr(std::move(result));
    }